

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const(&)[11],kj::ArrayPtr<char_const>&,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [11],
          ArrayPtr<const_char> *params_1,char (*params_2) [4])

{
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  kj *local_38;
  char *local_30;
  
  local_30 = (char *)strlen((char *)this);
  local_48.ptr = *(char **)*params;
  local_48.size_ = *(size_t *)(*params + 8);
  local_38 = this;
  local_58.size_ = strlen((char *)params_1);
  local_58.ptr = (char *)params_1;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}